

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

StringLiteral mp::internal::UncheckedCast<mp::StringLiteral>(Expr e)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> in_RDI;
  BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> *basic;
  StringLiteral expr;
  AssertionFailure *in_stack_ffffffffffffffd0;
  
  k = ExprBase::kind((ExprBase *)0x17fc73);
  bVar1 = Is<mp::StringLiteral>(k);
  if (!bVar1) {
    message = (char *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(in_stack_ffffffffffffffd0,message);
    __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  StringLiteral::StringLiteral((StringLiteral *)0x17fcda);
  Unused<mp::BasicExpr<(mp::expr::Kind)70,(mp::expr::Kind)70>*>
            ((BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> **)&stack0xffffffffffffffd0);
  return (StringLiteral)(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}